

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O3

bool __thiscall cppjieba::DictTrie::InsertUserWord(DictTrie *this,string *word,string *tag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  _Elt_pointer pDVar3;
  DictUnit node_info;
  DictUnit local_a0;
  
  local_a0.word.size_ = 0;
  local_a0.word.capacity_ = 0x10;
  paVar1 = &local_a0.tag.field_2;
  local_a0.tag._M_string_length = 0;
  local_a0.tag.field_2._M_local_buf[0] = '\0';
  local_a0.word.ptr_ = (uint *)&local_a0;
  local_a0.tag._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = MakeNodeInfo(this,&local_a0,word,this->user_word_default_weight_,tag);
  if (bVar2) {
    std::deque<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::push_back
              (&this->active_node_infos_,&local_a0);
    pDVar3 = (this->active_node_infos_).
             super__Deque_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pDVar3 == (this->active_node_infos_).
                  super__Deque_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_first) {
      pDVar3 = (this->active_node_infos_).
               super__Deque_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 4;
    }
    Trie::InsertNode(this->trie_,&local_a0.word,pDVar3 + -1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.tag._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.tag._M_dataplus._M_p);
  }
  if ((DictUnit *)local_a0.word.ptr_ != &local_a0) {
    free(local_a0.word.ptr_);
  }
  return bVar2;
}

Assistant:

bool InsertUserWord(const string& word, const string& tag = UNKNOWN_TAG) {
    DictUnit node_info;
    if (!MakeNodeInfo(node_info, word, user_word_default_weight_, tag)) {
      return false;
    }
    active_node_infos_.push_back(node_info);
    trie_->InsertNode(node_info.word, &active_node_infos_.back());
    return true;
  }